

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O2

void __thiscall
duckdb::CSVSniffer::CSVSniffer
          (CSVSniffer *this,CSVReaderOptions *options_p,MultiFileOptions *file_options,
          shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager_p,
          CSVStateMachineCache *state_machine_cache_p,bool default_null_to_varchar_p)

{
  SetColumns *this_00;
  _Rb_tree_header *p_Var1;
  vector<duckdb::LogicalType,_true> *pvVar2;
  CSVReaderOptions *pCVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  _Rb_tree_node_base *p_Var6;
  idx_t iVar7;
  long lVar8;
  initializer_list<const_char_*> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>
  __l_01;
  allocator_type local_174;
  less<duckdb::LogicalTypeId> local_173;
  allocator_type local_172;
  allocator_type local_171;
  vector<bool,_true> *local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_168;
  vector<duckdb::LogicalType,_true> *local_160;
  map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
  *local_158;
  map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
  *local_150;
  vector<duckdb::HeaderValue,_true> *local_148;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  *local_140;
  unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
  *local_138;
  map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
  *__range1;
  CSVError *local_128;
  shared_ptr<duckdb::CSVErrorHandler,_true> *local_120;
  pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_> local_118;
  undefined1 local_f8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_f0;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_d8;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_c0;
  char *local_a8;
  char *pcStack_a0;
  char *local_98;
  char *pcStack_90;
  char *local_88;
  char *pcStack_80;
  char *local_78;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  
  this->all_fail_max_line_size = true;
  local_128 = &this->line_error;
  CSVError::CSVError(local_128);
  this->state_machine_cache = state_machine_cache_p;
  (this->candidates).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->max_columns_found = 0;
  this->max_columns_found_error = 0;
  (this->candidates).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->candidates).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->options = options_p;
  this->file_options = file_options;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (buffer_manager_p->internal).
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (buffer_manager_p->internal).
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (buffer_manager_p->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  (buffer_manager_p->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this_00 = &this->set_columns;
  SetColumns::SetColumns(this_00);
  (this->detection_error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->detection_error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->lines_sniffed = 0;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = "%Y-%m-%d";
  pcStack_40 = "%y-%m-%d";
  local_58 = "%d-%m-%Y";
  pcStack_50 = "%d-%m-%y";
  local_68 = "%m-%d-%Y";
  pcStack_60 = "%m-%d-%y";
  __l._M_len = 6;
  __l._M_array = &local_68;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_c0,__l,&local_171);
  local_118.first = DATE;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_118.second.super_vector<const_char_*,_std::allocator<const_char_*>_>,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_c0);
  local_78 = "%y-%m-%d %H:%M:%S";
  local_88 = "%d-%m-%y %H:%M:%S";
  pcStack_80 = "%Y-%m-%d %H:%M:%S";
  local_98 = "%m-%d-%y %I:%M:%S %p";
  pcStack_90 = "%d-%m-%Y %H:%M:%S";
  local_a8 = "%Y-%m-%d %H:%M:%S.%f";
  pcStack_a0 = "%m-%d-%Y %I:%M:%S %p";
  __l_00._M_len = 7;
  __l_00._M_array = &local_a8;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_d8,__l_00,&local_172);
  local_f8 = 0x13;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_f0,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_d8);
  __l_01._M_len = 2;
  __l_01._M_array = &local_118;
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
  ::map(&this->format_template_candidates,__l_01,&local_173,&local_174);
  local_120 = &this->detection_error_handler;
  lVar8 = 0x28;
  __range1 = &this->format_template_candidates;
  do {
    ::std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)
               (&local_118.first + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x18);
  ::std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_d8);
  ::std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_c0);
  local_138 = &this->best_sql_types_candidates_per_column_idx;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_buckets =
       &(this->best_sql_types_candidates_per_column_idx)._M_h._M_single_bucket;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_bucket_count = 1;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count = 0;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140 = &this->best_candidate;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148 = &this->best_header_row;
  p_Var1 = &(this->format_candidates)._M_t._M_impl.super__Rb_tree_header;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->best_candidate).
  super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
  .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl =
       (StringValueScanner *)0x0;
  (this->best_header_row).super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->best_header_row).super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->best_header_row).super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_150 = &this->format_candidates;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->detected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->detected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->detected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->default_null_to_varchar = default_null_to_varchar_p;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_158 = &this->original_format_candidates;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  local_160 = &this->detected_types;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_168 = &this->names;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  local_170 = &this->manually_set;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  for (p_Var6 = (this->format_template_candidates)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(this->format_template_candidates)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
    this_01 = &::std::
               map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
               ::operator[](&this->best_format_candidates,(key_type *)(p_Var6 + 1))->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_01);
  }
  pvVar2 = this_00->types;
  if (pvVar2 == (vector<duckdb::LogicalType,_true> *)0x0) {
    iVar7 = 0;
  }
  else {
    iVar7 = ((long)(pvVar2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                   .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18;
  }
  this->max_columns_found = iVar7;
  make_shared_ptr<duckdb::CSVErrorHandler,bool_const&>((bool *)&local_118);
  shared_ptr<duckdb::CSVErrorHandler,_true>::operator=
            (&this->error_handler,(shared_ptr<duckdb::CSVErrorHandler,_true> *)&local_118);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118.second);
  local_a8 = (char *)CONCAT71(local_a8._1_7_,1);
  make_shared_ptr<duckdb::CSVErrorHandler,bool>((bool *)&local_118);
  shared_ptr<duckdb::CSVErrorHandler,_true>::operator=
            (local_120,(shared_ptr<duckdb::CSVErrorHandler,_true> *)&local_118);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118.second);
  pCVar3 = this->options;
  if (pCVar3->columns_set == true) {
    SetColumns::SetColumns((SetColumns *)&local_118,&pCVar3->sql_type_list,&pCVar3->name_list);
    this_00->types = (vector<duckdb::LogicalType,_true> *)CONCAT71(local_118._1_7_,local_118.first);
    (this->set_columns).names =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)local_118.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

CSVSniffer::CSVSniffer(CSVReaderOptions &options_p, const MultiFileOptions &file_options,
                       shared_ptr<CSVBufferManager> buffer_manager_p, CSVStateMachineCache &state_machine_cache_p,
                       bool default_null_to_varchar_p)
    : state_machine_cache(state_machine_cache_p), options(options_p), file_options(file_options),
      buffer_manager(std::move(buffer_manager_p)), lines_sniffed(0),
      default_null_to_varchar(default_null_to_varchar_p) {
	// Initialize Format Candidates
	for (const auto &format_template : format_template_candidates) {
		auto &logical_type = format_template.first;
		best_format_candidates[logical_type].clear();
	}
	// Initialize max columns found to either 0 or however many were set
	max_columns_found = set_columns.Size();
	error_handler = make_shared_ptr<CSVErrorHandler>(options.ignore_errors.GetValue());
	detection_error_handler = make_shared_ptr<CSVErrorHandler>(true);
	if (options.columns_set) {
		set_columns = SetColumns(&options.sql_type_list, &options.name_list);
	}
}